

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

size_t __thiscall
ktxValidator::validationContext::calcLevelOffset(validationContext *this,uint32_t level)

{
  uint uVar1;
  uint32_t uVar2;
  uint a;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  float fVar8;
  
  if ((this->header).vkFormat == 0) {
    __assert_fail("header.vkFormat != VK_FORMAT_UNDEFINED",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                  ,0x2cd,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
  }
  if ((this->header).supercompressionScheme == 0) {
    if (level < this->levelCount) {
      uVar1 = (this->header).dataFormatDescriptor.byteLength;
      sVar7 = this->levelIndexSize;
      uVar4 = (this->header).keyValueData.byteLength;
      a = (this->formatInfo).blockByteLength;
      if ((a & 3) != 0) {
        uVar2 = gcd(this,a,4);
        a = (a * 4) / uVar2;
      }
      fVar8 = ceilf((float)((ulong)uVar4 + uVar1 + sVar7 + 0x50) / (float)a);
      fVar8 = fVar8 * (float)a;
      uVar5 = (ulong)fVar8;
      sVar7 = (long)(fVar8 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
      uVar2 = this->levelCount;
      while (uVar2 = uVar2 - 1, level < uVar2) {
        sVar6 = calcLayerSize(this,uVar2);
        uVar1 = this->layerCount;
        uVar4 = (this->formatInfo).blockByteLength;
        if ((uVar4 & 3) != 0) {
          uVar3 = gcd(this,uVar4,4);
          uVar4 = (uVar4 * 4) / uVar3;
        }
        fVar8 = ceilf((float)(sVar6 * uVar1) / (float)uVar4);
        fVar8 = fVar8 * (float)uVar4;
        uVar5 = (ulong)fVar8;
        sVar7 = sVar7 + ((long)(fVar8 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5);
      }
      return sVar7;
    }
    __assert_fail("level < levelCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                  ,0x2d0,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
  }
  __assert_fail("header.supercompressionScheme == KTX_SS_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                ,0x2ce,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
}

Assistant:

size_t calcLevelOffset(uint32_t level) {
            // This function is only useful when the following 2 conditions
            // are met as otherwise we have no idea what the size of a level
            // ought to be.
            assert (header.vkFormat != VK_FORMAT_UNDEFINED);
            assert (header.supercompressionScheme == KTX_SS_NONE);

            assert (level < levelCount);
            // Calculate the expected base offset in the file
            size_t levelOffset = kvDataEndOffset();
            levelOffset
                  = padn(lcm4(formatInfo.blockByteLength), levelOffset);
            for (uint32_t i = levelCount - 1; i > level; i--) {
                size_t levelSize;
                levelSize = calcLevelSize(i);
                levelOffset
                    += padn(lcm4(formatInfo.blockByteLength), levelSize);
            }
            return levelOffset;
        }